

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase41::run(TestCase41 *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *func;
  Type *extraout_RDX_01;
  Type *extraout_RDX_02;
  Type *extraout_RDX_03;
  Type *func_00;
  Type *extraout_RDX_04;
  Type *extraout_RDX_05;
  Type *extraout_RDX_06;
  Type *func_01;
  Type *extraout_RDX_07;
  bool local_cf1;
  undefined1 auStack_cf0 [7];
  bool _kj_shouldLog_21;
  Maybe<capnp::StructSchema::Field> local_ce0;
  bool local_c91;
  undefined1 auStack_c90 [7];
  bool _kj_shouldLog_20;
  Maybe<capnp::StructSchema::Field> local_c80;
  bool local_c31;
  undefined1 auStack_c30 [7];
  bool _kj_shouldLog_19;
  Maybe<capnp::StructSchema::Field> local_c20;
  bool local_bd1;
  undefined1 auStack_bd0 [7];
  bool _kj_shouldLog_18;
  Maybe<capnp::StructSchema::Field> local_bc0;
  bool local_b71;
  undefined1 auStack_b70 [7];
  bool _kj_shouldLog_17;
  Maybe<capnp::StructSchema::Field> local_b60;
  bool local_b11;
  undefined1 auStack_b10 [7];
  bool _kj_shouldLog_16;
  Maybe<capnp::StructSchema::Field> local_b00;
  bool local_ab1;
  undefined1 auStack_ab0 [7];
  bool _kj_shouldLog_15;
  Schema local_aa0;
  Field local_a98;
  Reader local_a58;
  Reader local_a28;
  bool local_9f1;
  undefined1 auStack_9f0 [7];
  bool _kj_shouldLog_14;
  Field local_9e0;
  Reader local_9a0;
  Reader local_970;
  bool local_939;
  undefined1 local_938 [7];
  bool _kj_shouldLog_13;
  Reader local_908;
  bool local_8d1;
  undefined1 local_8d0 [7];
  bool _kj_shouldLog_12;
  Field local_898;
  bool local_851;
  undefined1 auStack_850 [7];
  bool _kj_shouldLog_11;
  undefined1 local_840 [8];
  Field lookup;
  Schema SStack_7f8;
  bool _kj_shouldLog_10;
  Reader local_7f0;
  ArrayPtr<const_char> local_7c0;
  bool local_7a9;
  undefined1 local_7a8 [7];
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_778;
  FieldList local_768;
  undefined1 local_730 [8];
  Field field;
  Reader local_6c0;
  Reader local_690;
  uint local_65c;
  FieldList local_658;
  uint local_61c;
  Fault local_618;
  Fault f;
  Reader local_5e0;
  Reader local_5b0;
  FieldList local_580;
  bool local_541;
  Schema *pSStack_540;
  bool _kj_shouldLog_8;
  Maybe<kj::Exception> local_538;
  bool local_3d1;
  Schema *pSStack_3d0;
  bool _kj_shouldLog_7;
  Maybe<kj::Exception> local_3c8;
  bool local_261;
  Schema SStack_260;
  bool _kj_shouldLog_6;
  bool local_255;
  bool _kj_shouldLog_5;
  Schema *local_248;
  Maybe<kj::Exception> local_240;
  bool local_d9;
  Schema SStack_d8;
  bool _kj_shouldLog_4;
  bool local_c9;
  Schema SStack_c8;
  bool _kj_shouldLog_3;
  Schema local_c0;
  bool local_b1;
  Schema SStack_b0;
  bool _kj_shouldLog_2;
  bool local_a1;
  Schema SStack_a0;
  bool _kj_shouldLog_1;
  Schema local_98;
  Reader local_90;
  uint64_t local_60;
  uint64_t local_58;
  bool local_49;
  undefined1 local_48 [7];
  bool _kj_shouldLog;
  Schema local_18;
  StructSchema schema;
  TestCase41 *this_local;
  
  schema.super_Schema.raw = (Schema)(Schema)this;
  local_18.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  uVar4 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  Schema::getProto((Reader *)local_48,&local_18);
  uVar5 = capnp::schema::Node::Reader::getId((Reader *)local_48);
  if (uVar4 != uVar5) {
    local_49 = kj::_::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      local_58 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                           ();
      Schema::getProto(&local_90,&local_18);
      local_60 = capnp::schema::Node::Reader::getId(&local_90);
      kj::_::Debug::log<char_const(&)[73],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x2c,ERROR,
                 "\"failed: expected \" \"(typeId<TestAllTypes>()) == (schema.getProto().getId())\", typeId<TestAllTypes>(), schema.getProto().getId()"
                 ,(char (*) [73])
                  "failed: expected (typeId<TestAllTypes>()) == (schema.getProto().getId())",
                 &local_58,&local_60);
      local_49 = false;
    }
  }
  uVar4 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
  local_98 = Schema::getDependency(&local_18,uVar4);
  SStack_a0.raw = (RawBrandedSchema *)Schema::from<capnp::schemas::TestEnum_9c8e9318b29d9cd3>();
  bVar1 = Schema::operator==(&local_98,&stack0xffffffffffffff60);
  if (!bVar1) {
    local_a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      kj::_::Debug::log<char_const(&)[86]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x2e,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()\""
                 ,(char (*) [86])
                  "failed: expected schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()"
                );
      local_a1 = false;
    }
  }
  uVar4 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
  SStack_b0 = Schema::getDependency(&local_18,uVar4);
  bVar1 = Schema::operator!=(&stack0xffffffffffffff50,&local_18);
  if (!bVar1) {
    local_b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_b1 != false) {
      kj::_::Debug::log<char_const(&)[68]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x2f,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) != schema\"",
                 (char (*) [68])
                 "failed: expected schema.getDependency(typeId<TestEnum>()) != schema");
      local_b1 = false;
    }
  }
  uVar4 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  local_c0 = Schema::getDependency(&local_18,uVar4);
  SStack_c8.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  bVar1 = Schema::operator==(&local_c0,&stack0xffffffffffffff38);
  if (!bVar1) {
    local_c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_c9 != false) {
      kj::_::Debug::log<char_const(&)[94]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x30,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()\""
                 ,(char (*) [94])
                  "failed: expected schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()"
                );
      local_c9 = false;
    }
  }
  uVar4 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  SStack_d8 = Schema::getDependency(&local_18,uVar4);
  bVar1 = Schema::operator==(&stack0xffffffffffffff28,&local_18);
  func = extraout_RDX;
  if (!bVar1) {
    local_d9 = kj::_::Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (local_d9 != false) {
      kj::_::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x31,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == schema\"",
                 (char (*) [72])
                 "failed: expected schema.getDependency(typeId<TestAllTypes>()) == schema");
      func = extraout_RDX_01;
      local_d9 = false;
    }
  }
  local_248 = &local_18;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase41::run()::__0>
            (&local_240,(kj *)&local_248,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_240,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_240);
  if (!bVar1) {
    local_255 = kj::_::Debug::shouldLog(ERROR);
    while (local_255 != false) {
      kj::_::Debug::log<char_const(&)[111]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr\""
                 ,(char (*) [111])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr"
                );
      local_255 = false;
    }
  }
  SStack_260.raw = (RawBrandedSchema *)Schema::asStruct(&local_18);
  bVar1 = Schema::operator==(&stack0xfffffffffffffda0,&local_18);
  func_00 = extraout_RDX_02;
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    func_00 = extraout_RDX_03;
    while (local_261 != false) {
      kj::_::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x34,ERROR,"\"failed: expected \" \"schema.asStruct() == schema\"",
                 (char (*) [45])"failed: expected schema.asStruct() == schema");
      func_00 = extraout_RDX_04;
      local_261 = false;
    }
  }
  pSStack_3d0 = &local_18;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase41::run()::__1>
            (&local_3c8,(kj *)&stack0xfffffffffffffc30,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_3c8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3c8);
  func_01 = extraout_RDX_05;
  if (!bVar1) {
    local_3d1 = kj::_::Debug::shouldLog(ERROR);
    func_01 = extraout_RDX_06;
    while (local_3d1 != false) {
      kj::_::Debug::log<char_const(&)[82]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x35,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr\""
                 ,(char (*) [82])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr"
                );
      func_01 = extraout_RDX_07;
      local_3d1 = false;
    }
  }
  pSStack_540 = &local_18;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase41::run()::__2>
            (&local_538,(kj *)&stack0xfffffffffffffac0,func_01);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_538,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_538);
  if (!bVar1) {
    local_541 = kj::_::Debug::shouldLog(ERROR);
    while (local_541 != false) {
      kj::_::Debug::log<char_const(&)[87]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x36,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr\""
                 ,(char (*) [87])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr"
                );
      local_541 = false;
    }
  }
  StructSchema::getFields(&local_580,(StructSchema *)&local_18);
  uVar2 = StructSchema::FieldList::size(&local_580);
  Schema::getProto((Reader *)&f,&local_18);
  capnp::schema::Node::Reader::getStruct(&local_5e0,(Reader *)&f);
  capnp::schema::Node::Struct::Reader::getFields(&local_5b0,&local_5e0);
  uVar3 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size(&local_5b0);
  if (uVar2 != uVar3) {
    StructSchema::getFields(&local_658,(StructSchema *)&local_18);
    local_61c = StructSchema::FieldList::size(&local_658);
    Schema::getProto((Reader *)&field.proto._reader.nestingLimit,&local_18);
    capnp::schema::Node::Reader::getStruct(&local_6c0,(Reader *)&field.proto._reader.nestingLimit);
    capnp::schema::Node::Struct::Reader::getFields(&local_690,&local_6c0);
    local_65c = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size(&local_690);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_618,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x38,FAILED,
               "(schema.getFields().size()) == (schema.getProto().getStruct().getFields().size())",
               "schema.getFields().size(), schema.getProto().getStruct().getFields().size()",
               &local_61c,&local_65c);
    kj::_::Debug::Fault::fatal(&local_618);
  }
  StructSchema::getFields(&local_768,(StructSchema *)&local_18);
  StructSchema::FieldList::operator[]((Field *)local_730,&local_768,0);
  StructSchema::Field::getProto((Reader *)local_7a8,(Field *)local_730);
  local_778 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_7a8);
  bVar1 = kj::operator==("voidField",(StringPtr *)&local_778);
  if (!bVar1) {
    local_7a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7a9 != false) {
      StructSchema::Field::getProto(&local_7f0,(Field *)local_730);
      local_7c0 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_7f0);
      kj::_::Debug::log<char_const(&)[63],char_const(&)[10],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3a,ERROR,
                 "\"failed: expected \" \"(\\\"voidField\\\") == (field.getProto().getName())\", \"voidField\", field.getProto().getName()"
                 ,(char (*) [63])"failed: expected (\"voidField\") == (field.getProto().getName())",
                 (char (*) [10])"voidField",(Reader *)&local_7c0);
      local_7a9 = false;
    }
  }
  SStack_7f8.raw = (RawBrandedSchema *)StructSchema::Field::getContainingStruct((Field *)local_730);
  bVar1 = Schema::operator==(&stack0xfffffffffffff808,&local_18);
  if (!bVar1) {
    lookup.proto._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (lookup.proto._reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3b,ERROR,"\"failed: expected \" \"field.getContainingStruct() == schema\"",
                 (char (*) [55])"failed: expected field.getContainingStruct() == schema");
      lookup.proto._reader._47_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_850,"voidField");
  StructSchema::getFieldByName((Field *)local_840,(StructSchema *)&local_18,(StringPtr)_auStack_850)
  ;
  bVar1 = StructSchema::Field::operator==((Field *)local_840,(Field *)local_730);
  if (!bVar1) {
    local_851 = kj::_::Debug::shouldLog(ERROR);
    while (local_851 != false) {
      kj::_::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"lookup == field\"",
                 (char (*) [33])"failed: expected lookup == field");
      local_851 = false;
    }
  }
  StructSchema::getFields((FieldList *)local_8d0,(StructSchema *)&local_18);
  StructSchema::FieldList::operator[](&local_898,(FieldList *)local_8d0,1);
  bVar1 = StructSchema::Field::operator!=((Field *)local_840,&local_898);
  if (!bVar1) {
    local_8d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8d1 != false) {
      kj::_::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3f,ERROR,"\"failed: expected \" \"lookup != schema.getFields()[1]\"",
                 (char (*) [49])"failed: expected lookup != schema.getFields()[1]");
      local_8d1 = false;
    }
  }
  StructSchema::Field::getProto((Reader *)local_938,(Field *)local_840);
  capnp::schema::Field::Reader::getSlot(&local_908,(Reader *)local_938);
  bVar1 = capnp::schema::Field::Slot::Reader::getHadExplicitDefault(&local_908);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_939 = kj::_::Debug::shouldLog(ERROR);
    while (local_939 != false) {
      kj::_::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"!(lookup.getProto().getSlot().getHadExplicitDefault())\"",
                 (char (*) [72])
                 "failed: expected !(lookup.getProto().getSlot().getHadExplicitDefault())");
      local_939 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_9f0,"int32Field");
  StructSchema::getFieldByName(&local_9e0,(StructSchema *)&local_18,(StringPtr)_auStack_9f0);
  StructSchema::Field::getProto(&local_9a0,&local_9e0);
  capnp::schema::Field::Reader::getSlot(&local_970,&local_9a0);
  bVar1 = capnp::schema::Field::Slot::Reader::getHadExplicitDefault(&local_970);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_9f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_9f1 != false) {
      kj::_::Debug::log<char_const(&)[101]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"!(schema.getFieldByName(\\\"int32Field\\\").getProto().getSlot().getHadExplicitDefault())\""
                 ,(char (*) [101])
                  "failed: expected !(schema.getFieldByName(\"int32Field\").getProto().getSlot().getHadExplicitDefault())"
                );
      local_9f1 = false;
    }
  }
  local_aa0.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestDefaults>();
  kj::StringPtr::StringPtr((StringPtr *)auStack_ab0,"int32Field");
  StructSchema::getFieldByName(&local_a98,(StructSchema *)&local_aa0,(StringPtr)_auStack_ab0);
  StructSchema::Field::getProto(&local_a58,&local_a98);
  capnp::schema::Field::Reader::getSlot(&local_a28,&local_a58);
  bVar1 = capnp::schema::Field::Slot::Reader::getHadExplicitDefault(&local_a28);
  if (!bVar1) {
    local_ab1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ab1 != false) {
      kj::_::Debug::log<char_const(&)[121]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"Schema::from<TestDefaults>().getFieldByName(\\\"int32Field\\\") .getProto().getSlot().getHadExplicitDefault()\""
                 ,(char (*) [121])
                  "failed: expected Schema::from<TestDefaults>().getFieldByName(\"int32Field\") .getProto().getSlot().getHadExplicitDefault()"
                );
      local_ab1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_b10,"noSuchField");
  StructSchema::findFieldByName(&local_b00,(StructSchema *)&local_18,(StringPtr)_auStack_b10);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_b00,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_b00);
  if (!bVar1) {
    local_b11 = kj::_::Debug::shouldLog(ERROR);
    while (local_b11 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x47,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"noSuchField\\\") == nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"noSuchField\") == nullptr");
      local_b11 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_b70,"int32Field");
  StructSchema::findFieldByName(&local_b60,(StructSchema *)&local_18,(StringPtr)_auStack_b70);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_b60,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_b60);
  if (!bVar1) {
    local_b71 = kj::_::Debug::shouldLog(ERROR);
    while (local_b71 != false) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x49,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"int32Field\\\") != nullptr\"",
                 (char (*) [65])"failed: expected schema.findFieldByName(\"int32Field\") != nullptr"
                );
      local_b71 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_bd0,"float32List");
  StructSchema::findFieldByName(&local_bc0,(StructSchema *)&local_18,(StringPtr)_auStack_bd0);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_bc0,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_bc0);
  if (!bVar1) {
    local_bd1 = kj::_::Debug::shouldLog(ERROR);
    while (local_bd1 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"float32List\\\") != nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"float32List\") != nullptr");
      local_bd1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_c30,"dataList");
  StructSchema::findFieldByName(&local_c20,(StructSchema *)&local_18,(StringPtr)_auStack_c30);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_c20,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_c20);
  if (!bVar1) {
    local_c31 = kj::_::Debug::shouldLog(ERROR);
    while (local_c31 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"dataList\\\") != nullptr\"",
                 (char (*) [63])"failed: expected schema.findFieldByName(\"dataList\") != nullptr");
      local_c31 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_c90,"textField");
  StructSchema::findFieldByName(&local_c80,(StructSchema *)&local_18,(StringPtr)_auStack_c90);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_c80,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_c80);
  if (!bVar1) {
    local_c91 = kj::_::Debug::shouldLog(ERROR);
    while (local_c91 != false) {
      kj::_::Debug::log<char_const(&)[64]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4c,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"textField\\\") != nullptr\"",
                 (char (*) [64])"failed: expected schema.findFieldByName(\"textField\") != nullptr")
      ;
      local_c91 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_cf0,"structField");
  StructSchema::findFieldByName(&local_ce0,(StructSchema *)&local_18,(StringPtr)_auStack_cf0);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_ce0,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_ce0);
  if (!bVar1) {
    local_cf1 = kj::_::Debug::shouldLog(ERROR);
    while (local_cf1 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4d,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"structField\\\") != nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"structField\") != nullptr");
      local_cf1 = false;
    }
  }
  return;
}

Assistant:

TEST(Schema, Structs) {
  StructSchema schema = Schema::from<TestAllTypes>();

  EXPECT_EQ(typeId<TestAllTypes>(), schema.getProto().getId());

  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>());
  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) != schema);
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>());
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == schema);
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestDefaults>()));

  EXPECT_TRUE(schema.asStruct() == schema);
  EXPECT_NONFATAL_FAILURE(schema.asEnum());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());

  ASSERT_EQ(schema.getFields().size(), schema.getProto().getStruct().getFields().size());
  StructSchema::Field field = schema.getFields()[0];
  EXPECT_EQ("voidField", field.getProto().getName());
  EXPECT_TRUE(field.getContainingStruct() == schema);

  StructSchema::Field lookup = schema.getFieldByName("voidField");
  EXPECT_TRUE(lookup == field);
  EXPECT_TRUE(lookup != schema.getFields()[1]);
  EXPECT_FALSE(lookup.getProto().getSlot().getHadExplicitDefault());

  EXPECT_FALSE(schema.getFieldByName("int32Field").getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(Schema::from<TestDefaults>().getFieldByName("int32Field")
      .getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(schema.findFieldByName("noSuchField") == nullptr);

  EXPECT_TRUE(schema.findFieldByName("int32Field") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("float32List") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("dataList") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("textField") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("structField") != nullptr);
}